

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O2

void __thiscall QGnomeThemePrivate::configureFonts(QGnomeThemePrivate *this,QString *gtkFontName)

{
  int pointSize;
  qsizetype qVar1;
  QFont *pQVar2;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  long in_FS_OFFSET;
  float fVar5;
  QStringView QVar6;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_80;
  char *local_68;
  QDebug local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QString::lastIndexOf(gtkFontName,(QChar)0x20,CaseSensitive);
  local_58.ptr = (gtkFontName->d).ptr;
  local_58.d = (Data *)(gtkFontName->d).size;
  QVar6 = QStringView::mid((QStringView *)&local_58,(long)((int)qVar1 + 1),-1);
  local_80.d._0_4_ = (undefined4)QVar6.m_size;
  local_80._4_8_ = QVar6._4_8_;
  local_80.ptr._4_4_ = QVar6.m_data._4_4_;
  fVar5 = (float)QStringView::toFloat((bool *)&local_80);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::left((QString *)&local_58,gtkFontName,(long)(int)qVar1);
  pQVar2 = (QFont *)operator_new(0x10);
  QFont::QFont(pQVar2,(QString *)&local_58,(int)fVar5,-1,false);
  this->systemFont = pQVar2;
  pQVar2 = (QFont *)operator_new(0x10);
  qVar1 = QtPrivate::lengthHelperPointer<char>("monospace");
  latin1.m_data = "monospace";
  latin1.m_size = qVar1;
  QString::QString((QString *)&local_80,latin1);
  pointSize = QFont::pointSize(this->systemFont);
  QFont::QFont(pQVar2,(QString *)&local_80,pointSize,-1,false);
  this->fixedFont = pQVar2;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QFont::setStyleHint(this->fixedFont,Courier,PreferDefault);
  pQVar3 = QtPrivateLogging::lcQpaFonts();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_68 = pQVar3->name;
    local_80.d._0_4_ = 2;
    local_80._4_8_ = 0;
    local_80.ptr._4_4_ = 0;
    local_80.size._0_4_ = 0;
    local_80.size._4_4_ = 0;
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(&local_60,"default fonts: system");
    pQVar4 = QDebug::operator<<(pQVar4,this->systemFont);
    pQVar4 = QDebug::operator<<(pQVar4,"fixed");
    QDebug::operator<<(pQVar4,this->fixedFont);
    QDebug::~QDebug(&local_60);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGnomeThemePrivate::configureFonts(const QString &gtkFontName) const
{
    Q_ASSERT(!systemFont);
    const int split = gtkFontName.lastIndexOf(QChar::Space);
    float size = QStringView{gtkFontName}.mid(split + 1).toFloat();
    QString fontName = gtkFontName.left(split);

    systemFont = new QFont(fontName, size);
    fixedFont = new QFont(QLatin1StringView(QGenericUnixTheme::defaultFixedFontNameC), systemFont->pointSize());
    fixedFont->setStyleHint(QFont::TypeWriter);
    qCDebug(lcQpaFonts) << "default fonts: system" << systemFont << "fixed" << fixedFont;
}